

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrnicmp(const_bstring b0,const_bstring b1,int n)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  __int32_t **pp_Var10;
  ulong uVar11;
  ulong uVar12;
  
  iVar9 = -0x8000;
  if ((((b0 != (const_bstring)0x0) && (puVar5 = b0->data, puVar5 != (uchar *)0x0)) &&
      (uVar3 = b0->slen, b1 != (const_bstring)0x0 && -1 < (int)uVar3)) &&
     ((puVar6 = b1->data, puVar6 != (uchar *)0x0 && (uVar4 = b1->slen, -1 < (int)(uVar4 | n))))) {
    uVar8 = n;
    if ((int)uVar3 < n) {
      uVar8 = uVar3;
    }
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    if (puVar5 == puVar6) {
LAB_0012da84:
      iVar9 = 0;
      if (uVar3 != uVar4 && uVar8 != n) {
        pp_Var10 = __ctype_tolower_loc();
        if ((int)uVar8 < (int)uVar3) {
          cVar7 = (char)(*pp_Var10)[puVar5[(int)uVar8]];
          iVar9 = 0x100;
          if (cVar7 != '\0') {
            iVar9 = (int)cVar7;
          }
        }
        else {
          iVar9 = (*pp_Var10)[puVar6[(int)uVar8]] << 0x18;
          if (iVar9 == 0) {
            iVar9 = -0x100;
          }
          else {
            iVar9 = -(iVar9 >> 0x18);
          }
        }
      }
    }
    else {
      uVar12 = 0;
      uVar11 = 0;
      if (0 < (int)uVar8) {
        uVar11 = (ulong)uVar8;
      }
      do {
        if (uVar11 == uVar12) goto LAB_0012da84;
        pp_Var10 = __ctype_tolower_loc();
        pbVar1 = puVar5 + uVar12;
        pbVar2 = puVar6 + uVar12;
        uVar12 = uVar12 + 1;
      } while ((char)(*pp_Var10)[*pbVar2] == (char)(*pp_Var10)[*pbVar1]);
      iVar9 = (uint)*pbVar1 - (uint)*pbVar2;
    }
  }
  return iVar9;
}

Assistant:

int bstrnicmp (const_bstring b0, const_bstring b1, int n) {
int i, v, m;

	if (bdata (b0) == NULL || b0->slen < 0 ||
	    bdata (b1) == NULL || b1->slen < 0 || n < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v  = (char) downcase (b0->data[i]);
			v -= (char) downcase (b1->data[i]);
			if (v != 0) return b0->data[i] - b1->data[i];
		}
	}

	if (n == m || b0->slen == b1->slen) return BSTR_OK;

	if (b0->slen > m) {
		v = (char) downcase (b0->data[m]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}

	v = - (char) downcase (b1->data[m]);
	if (v) return v;
	return - (int) (UCHAR_MAX + 1);
}